

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O3

void __thiscall CrashTest_SigsegvTest_Test::TestBody(CrashTest_SigsegvTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  char cVar4;
  DeathTest *pDVar5;
  DeathTest *gtest_dt;
  DeathTest *local_e8;
  DeathTest *local_e0;
  AssertHelper local_d8 [4];
  RE local_b8;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init(&local_b8,"");
    bVar2 = testing::internal::DeathTest::Create
                      ("RaiseSigsegv()",&local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
                       ,0x1a,&local_e8);
    pDVar5 = local_e8;
    if (bVar2) {
      if (local_e8 == (DeathTest *)0x0) {
LAB_0010b634:
        testing::internal::RE::~RE(&local_b8);
        return;
      }
      local_e0 = local_e8;
      iVar3 = (*local_e8->_vptr_DeathTest[2])(local_e8);
      pDVar1 = local_e8;
      if (iVar3 == 0) {
        iVar3 = (*local_e8->_vptr_DeathTest[3])(local_e8);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*local_e8->_vptr_DeathTest[4])(local_e8,(ulong)bVar2);
        cVar4 = (char)iVar3;
      }
      else {
        cVar4 = '\x01';
        if (iVar3 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            RaiseSigsegv();
          }
          (*local_e8->_vptr_DeathTest[5])(local_e8,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
          pDVar5 = local_e0;
          if (local_e0 == (DeathTest *)0x0) goto LAB_0010b634;
        }
      }
      bVar2 = testing::internal::IsTrue(true);
      if (bVar2) {
        (*pDVar5->_vptr_DeathTest[1])(pDVar5);
      }
      if (cVar4 != '\0') goto LAB_0010b634;
    }
    testing::internal::RE::~RE(&local_b8);
  }
  testing::Message::Message((Message *)&local_b8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,0x1a,message);
  testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(local_d8);
  if ((((long *)local_b8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_b8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_b8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST (CrashTest, SigsegvTest) {
    ASSERT_DEATH(RaiseSigsegv(), "");
}